

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect.hpp
# Opt level: O3

iterator_range<burst::intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>_>
* __thiscall
burst::intersect_t::operator()
          (iterator_range<burst::intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>_>
           *__return_storage_ptr__,intersect_t *this,
          tuple<std::initializer_list<int>_&,_std::initializer_list<int>_&,_std::initializer_list<int>_&>
          *args)

{
  intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
  *in_RCX;
  intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
  end;
  intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
  begin;
  intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
  local_138;
  element_type *local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_f0;
  iterator_range<const_int_*> *local_e8;
  element_type *local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d8;
  iterator_range<const_int_*> *local_d0;
  intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
  local_b8;
  intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
  local_78;
  initializer_list<int> *local_38;
  initializer_list<int> *piStack_30;
  initializer_list<int> *local_28;
  
  local_38 = (args->
             super__Tuple_impl<0UL,_std::initializer_list<int>_&,_std::initializer_list<int>_&,_std::initializer_list<int>_&>
             ).super__Tuple_impl<1UL,_std::initializer_list<int>_&,_std::initializer_list<int>_&>.
             super__Tuple_impl<2UL,_std::initializer_list<int>_&>.
             super__Head_base<2UL,_std::initializer_list<int>_&,_false>._M_head_impl;
  piStack_30 = (args->
               super__Tuple_impl<0UL,_std::initializer_list<int>_&,_std::initializer_list<int>_&,_std::initializer_list<int>_&>
               ).super__Tuple_impl<1UL,_std::initializer_list<int>_&,_std::initializer_list<int>_&>.
               super__Head_base<1UL,_std::initializer_list<int>_&,_false>._M_head_impl;
  local_28 = (args->
             super__Tuple_impl<0UL,_std::initializer_list<int>_&,_std::initializer_list<int>_&,_std::initializer_list<int>_&>
             ).super__Head_base<0UL,_std::initializer_list<int>_&,_false>._M_head_impl;
  make_intersect_iterator<std::initializer_list<int>,std::initializer_list<int>,std::initializer_list<int>>
            (&local_78,(burst *)&local_38,args);
  intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
  ::intersect_iterator(&local_b8,&local_78);
  local_f8 = local_78.m_begin.m_container.
             super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  p_Stack_f0 = local_78.m_begin.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
  local_78.m_begin.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_78.m_begin.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_e8 = local_78.m_begin.m_iterator._M_current;
  local_e0 = local_78.m_end.m_container.
             super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  p_Stack_d8 = local_78.m_end.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
  local_78.m_end.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_78.m_end.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d0 = local_78.m_end.m_iterator._M_current;
  local_138.m_begin.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_b8.m_begin.m_container.
            super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_138.m_begin.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_b8.m_begin.m_container.
       super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_b8.m_begin.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_b8.m_begin.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_138.m_begin.m_iterator._M_current = local_b8.m_begin.m_iterator._M_current;
  local_138.m_end.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_b8.m_end.m_container.
            super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_138.m_end.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_b8.m_end.m_container.
       super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_b8.m_end.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_b8.m_end.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_138.m_end.m_iterator._M_current = local_b8.m_end.m_iterator._M_current;
  boost::
  make_iterator_range<burst::intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>,std::less<void>>>
            (__return_storage_ptr__,(boost *)&local_f8,&local_138,in_RCX);
  if (local_138.m_end.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138.m_end.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_138.m_begin.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138.m_begin.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (p_Stack_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d8);
  }
  if (p_Stack_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_f0);
  }
  if (local_b8.m_end.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.m_end.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_b8.m_begin.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.m_begin.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_78.m_end.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.m_end.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_78.m_begin.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.m_begin.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Args && ... args) const
        {
            auto begin = make_intersect_iterator(std::forward<Args>(args)...);
            auto end = make_intersect_iterator(iterator::end_tag, begin);

            return boost::make_iterator_range(std::move(begin), std::move(end));
        }